

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Options::WarningsOptionParser::optionDescription_abi_cxx11_
          (string *__return_storage_ptr__,WarningsOptionParser *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "Enables the named warnings. If the warnings are violated the test case is failed.\n\nAt present only one warning has been provided: NoAssertions. If this warning is enabled then any test case that completes without an assertions (CHECK, REQUIRE etc) being encountered violates the warning.\n\ne.g.:\n\n    -w NoAssertions"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string optionDescription() const {
                return
                    "Enables the named warnings. If the warnings are violated the test case is "
                    "failed.\n"
                    "\n"
                    "At present only one warning has been provided: NoAssertions. If this warning "
                    "is enabled then any test case that completes without an assertions (CHECK, "
                    "REQUIRE etc) being encountered violates the warning.\n"
                    "\n"
                    "e.g.:\n"
                    "\n"
                    "    -w NoAssertions";
            }